

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

bool Corrade::Utility::Path::make(StringView path)

{
  StringView value;
  StringView value_00;
  StringView SVar1;
  bool bVar2;
  int iVar3;
  char *__path;
  int *piVar4;
  Debug *pDVar5;
  undefined8 in_RCX;
  size_t sVar6;
  StringView SVar7;
  byte local_179;
  Flags local_161;
  undefined1 local_160 [8];
  Error err;
  Flags local_121;
  Error local_120;
  StringView local_f8;
  undefined4 local_e8;
  ostream *local_d8;
  char *pcStack_d0;
  undefined1 local_c8 [8];
  String pathNullTerminated;
  size_t local_88;
  Pair<Corrade::Containers::BasicStringView<const_char>,_Corrade::Containers::BasicStringView<const_char>_>
  local_60;
  undefined1 local_40 [8];
  StringView parentPath;
  undefined1 auStack_20 [8];
  StringView path_local;
  
  path_local._data = (char *)path._sizePlusFlags;
  auStack_20 = (undefined1  [8])path._data;
  bVar2 = Containers::BasicStringView::operator_cast_to_bool((BasicStringView *)auStack_20);
  if (bVar2) {
    bVar2 = Containers::BasicStringView<const_char>::hasSuffix
                      ((BasicStringView<const_char> *)auStack_20,'/');
    if (bVar2) {
      join_0x00000010_0x00000000_ =
           Containers::BasicStringView<const_char>::exceptSuffix
                     ((BasicStringView<const_char> *)auStack_20,1);
      path_local._sizePlusFlags._7_1_ = make(join_0x00000010_0x00000000_);
    }
    else {
      SVar1._sizePlusFlags = (size_t)path_local._data;
      SVar1._data = (char *)auStack_20;
      split(&local_60,SVar1);
      _local_40 = Containers::
                  Pair<Corrade::Containers::BasicStringView<const_char>,_Corrade::Containers::BasicStringView<const_char>_>
                  ::first(&local_60);
      bVar2 = Containers::BasicStringView::operator_cast_to_bool((BasicStringView *)local_40);
      SVar1 = _local_40;
      sVar6 = CONCAT71((int7)((ulong)in_RCX >> 8),bVar2);
      local_179 = 0;
      if (bVar2) {
        SVar7 = Containers::Literals::StringLiterals::operator____s("/",1);
        local_88 = SVar7._sizePlusFlags;
        bVar2 = Containers::operator!=(SVar1,SVar7);
        sVar6 = CONCAT71((int7)(local_88 >> 8),bVar2);
        local_179 = 0;
        if (bVar2) {
          bVar2 = exists(_local_40);
          sVar6 = CONCAT71((int7)(sVar6 >> 8),bVar2);
          local_179 = 0;
          if (!bVar2) {
            pathNullTerminated.field_0._large.size = (size_t)local_40;
            bVar2 = make(_local_40);
            local_179 = bVar2 ^ 0xff;
          }
        }
      }
      if ((local_179 & 1) == 0) {
        local_d8 = (ostream *)auStack_20;
        pcStack_d0 = path_local._data;
        SVar7._sizePlusFlags = sVar6;
        SVar7._data = path_local._data;
        Containers::String::nullTerminatedView((String *)local_c8,(String *)auStack_20,SVar7);
        __path = Containers::String::data((String *)local_c8);
        iVar3 = mkdir(__path,0x1ff);
        if (iVar3 == 0) {
          path_local._sizePlusFlags._7_1_ = 1;
          local_e8 = 1;
        }
        else {
          piVar4 = __errno_location();
          if (*piVar4 == 0x11) {
            Containers::BasicStringView<const_char>::BasicStringView<const_char,_0>
                      (&local_f8,(String *)local_c8);
            bVar2 = isDirectory(local_f8);
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              path_local._sizePlusFlags._7_1_ = 1;
              local_e8 = 1;
            }
            else {
              Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
                        (&local_121);
              Error::Error(&local_120,local_121);
              pDVar5 = Debug::operator<<(&local_120.super_Debug,"Utility::Path::make():");
              err._previousGlobalErrorOutput = (ostream *)auStack_20;
              value_00._sizePlusFlags = (size_t)path_local._data;
              value_00._data = (char *)auStack_20;
              pDVar5 = Debug::operator<<(pDVar5,value_00);
              Debug::operator<<(pDVar5,"exists but is not a directory");
              Error::~Error(&local_120);
              path_local._sizePlusFlags._7_1_ = 0;
              local_e8 = 1;
            }
          }
          else {
            Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
                      (&local_161);
            Error::Error((Error *)local_160,local_161);
            pDVar5 = Debug::operator<<((Debug *)local_160,"Utility::Path::make(): can\'t create");
            value._sizePlusFlags = (size_t)path_local._data;
            value._data = (char *)auStack_20;
            pDVar5 = Debug::operator<<(pDVar5,value);
            pDVar5 = Debug::operator<<(pDVar5,Debug::nospace);
            Debug::operator<<(pDVar5,":");
            piVar4 = __errno_location();
            Implementation::printErrnoErrorString((Debug *)local_160,*piVar4);
            path_local._sizePlusFlags._7_1_ = 0;
            local_e8 = 1;
            Error::~Error((Error *)local_160);
          }
        }
        Containers::String::~String((String *)local_c8);
      }
      else {
        path_local._sizePlusFlags._7_1_ = 0;
      }
    }
  }
  else {
    path_local._sizePlusFlags._7_1_ = 1;
  }
  return (bool)(path_local._sizePlusFlags._7_1_ & 1);
}

Assistant:

bool make(const Containers::StringView path) {
    if(!path) return true;

    /* If the path contains trailing slash, strip it */
    if(path.hasSuffix('/'))
        return make(path.exceptSuffix(1));

    /* If parent directory doesn't exist, create it. That means two syscalls to
       create each parent (and two null-terminated string allocations on Unix /
       two UTF-16 conversions on Windows). I could also directly call into
       make() without checking exists() first, relying on mkdir() failing with
       EEXIST instead -- while that would save one syscall per path component
       that doesn't exist, for long paths that already exist (which is
       supposedly the more common scenario) it would mean mkdir() gets called
       once for each component instead of just one existence check for the
       parent and one mkdir() for the leaf directory. */
    const Containers::StringView parentPath = split(path).first();
    /* Can't use !isDirectory(parentPath) as it's not reliable on all platforms
       and could make the function fail even before attempting to create
       anything. With exists() the error message is slightly shittier if the
       parentPath is a file, but at least it doesn't fail. See the other use of
       isDirectory() below for more details. */
    if(parentPath && parentPath != "/"_s && !exists(parentPath) && !make(parentPath))
        return false;

    /* Create the leaf directory, return true if successfully created */
    #if defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN) || (defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT))
    #if defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)
    const Containers::String pathNullTerminated = Containers::String::nullTerminatedView(path);
    #elif defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)
    const Containers::Array<wchar_t> pathWide = Unicode::widen(path);
    #else
    #error
    #endif
    if(
        /* Unix, Emscripten */
        #if defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)
        mkdir(pathNullTerminated.data(), 0777) == 0
        /* Windows (not Store/Phone) */
        #elif defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)
        CreateDirectoryW(pathWide.data(), nullptr) != 0
        #else
        #error
        #endif
    )
        return true;

    /* If already exists, return false if it's not a directory */
    if(
        /* Unix, Emscripten */
        #if defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)
        errno == EEXIST
        /* Windows (not Store/Phone) */
        #elif defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)
        GetLastError() == ERROR_ALREADY_EXISTS
        #else
        #error
        #endif
    ) {
        /* isDirectory() is known to work correctly only on Unix and
           Emscripten, not on iOS, and on Windows only partially, see the
           comments in the implementation above. The main goal is to have
           Path::make() work correctly in the happy cases, i.e. have it create
           the path if at all possible, and return true. In comparison, having
           it return `false` if the path exists but is a file, is only a
           nice-to-have behavior for rare scenarios. So skipping this extra
           check on platforms that can't detect a directory properly (and thus
           silently returning true even if the existing path may not be a
           directory) is not that of a big deal compared to failing always. */
        #if (defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)) || ((defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)) && !defined(CORRADE_TARGET_IOS))
        #if defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)
        const DWORD fileAttributes = GetFileAttributesW(pathWide);
        #endif
        if(
            /* On iOS (Simulator at least) stat() is a no-op, returning random
               values, thus isDirectory() returns false for it */
            #if (defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)) && !defined(CORRADE_TARGET_IOS)
            !isDirectory(pathNullTerminated)
            /* On Windows isDirectory() doesn't treat symlinks properly yet,
               as a workaround we treat symlinks as "may be a directory as
               well" to not have a failure in case the path exists and is a
               symlink to a directory. Furthermore, INVALID_FILE_ATTRIBUTES
               contain the FILE_ATTRIBUTE_DIRECTORY bit for some reason -- so
               if it wouldn't check for INVALID_FILE_ATTRIBUTES first, files
               that fail to query would still be treated as "fine, it's a
               directory". */
            #elif defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)
            fileAttributes != INVALID_FILE_ATTRIBUTES &&
                /* No idea what a "directory reparse point" is, but
                    https://learn.microsoft.com/en-us/windows/win32/fileio/file-attribute-constants
                   says it's set for symlinks as well */
                !(fileAttributes & FILE_ATTRIBUTE_REPARSE_POINT) &&
                !(fileAttributes & FILE_ATTRIBUTE_DIRECTORY)
            #else
            #error
            #endif
        ) {
            Error{} << "Utility::Path::make():" << path << "exists but is not a directory";
            return false;
        }
        #endif

        return true;
    }

    Error err;
    err << "Utility::Path::make(): can't create" << path << Debug::nospace << ":";
    #if defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)
    Utility::Implementation::printErrnoErrorString(err, errno);
    #elif defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)
    Utility::Implementation::printWindowsErrorString(err, GetLastError());
    #else
    #error
    #endif
    return false;
    #else
    Error{} << "Utility::Path::make(): not implemented on this platform";
    return false;
    #endif
}